

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

void __thiscall
llvm::Triple::Triple
          (Triple *this,Twine *ArchStr,Twine *VendorStr,Twine *OSStr,Twine *EnvironmentStr)

{
  undefined1 auVar1 [16];
  ArchType AVar2;
  SubArchType SVar3;
  VendorType VVar4;
  OSType OVar5;
  EnvironmentType EVar6;
  ObjectFormatType OVar7;
  undefined8 uVar8;
  char *pcVar9;
  size_t sVar10;
  Twine local_288;
  StringRef local_268;
  Twine local_258;
  StringRef local_238;
  Twine local_228;
  StringRef local_208;
  Twine local_1f8;
  StringRef local_1d8;
  Twine local_1c8;
  StringRef local_1a8;
  undefined1 local_198 [48];
  Twine local_168;
  Twine local_150;
  Twine local_138;
  Twine local_120;
  Twine local_108;
  Twine local_f0;
  Twine local_d8;
  Twine local_c0;
  Twine local_a8;
  Twine *local_90;
  Twine *EnvironmentStr_local;
  Twine *OSStr_local;
  Twine *VendorStr_local;
  Twine *ArchStr_local;
  Triple *this_local;
  undefined1 *local_60;
  Twine *local_58;
  StringRef *local_50;
  Twine *local_48;
  StringRef *local_40;
  Twine *local_38;
  StringRef *local_30;
  Twine *local_28;
  StringRef *local_20;
  Twine *local_18;
  StringRef *local_10;
  
  local_90 = EnvironmentStr;
  EnvironmentStr_local = OSStr;
  OSStr_local = VendorStr;
  VendorStr_local = ArchStr;
  ArchStr_local = (Twine *)this;
  Twine::Twine(&local_138,'-');
  llvm::operator+(&local_120,ArchStr,&local_138);
  llvm::operator+(&local_108,&local_120,OSStr_local);
  Twine::Twine(&local_150,'-');
  llvm::operator+(&local_f0,&local_108,&local_150);
  llvm::operator+(&local_d8,&local_f0,EnvironmentStr_local);
  Twine::Twine(&local_168,'-');
  llvm::operator+(&local_c0,&local_d8,&local_168);
  llvm::operator+(&local_a8,&local_c0,local_90);
  Twine::str_abi_cxx11_((Twine *)this);
  Twine::str_abi_cxx11_((Twine *)local_198);
  local_60 = local_198 + 0x20;
  this_local = (Triple *)local_198;
  uVar8 = std::__cxx11::string::data();
  auVar1 = local_198._32_16_;
  local_198._32_4_ = (ArchType)uVar8;
  local_198._36_4_ = SUB84(uVar8,4);
  local_198._32_16_ = auVar1;
  uVar8 = std::__cxx11::string::length();
  auVar1 = local_198._32_16_;
  local_198._40_4_ = (VendorType)uVar8;
  local_198._44_4_ = SUB84(uVar8,4);
  local_198._32_16_ = auVar1;
  AVar2 = parseArch((StringRef)local_198._32_16_);
  std::__cxx11::string::~string((string *)local_198);
  this->Arch = AVar2;
  Twine::str_abi_cxx11_(&local_1c8);
  local_50 = &local_1a8;
  local_58 = &local_1c8;
  pcVar9 = (char *)std::__cxx11::string::data();
  local_1a8.Data = pcVar9;
  sVar10 = std::__cxx11::string::length();
  local_1a8.Length = sVar10;
  SVar3 = parseSubArch(local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  this->SubArch = SVar3;
  Twine::str_abi_cxx11_(&local_1f8);
  local_40 = &local_1d8;
  local_48 = &local_1f8;
  pcVar9 = (char *)std::__cxx11::string::data();
  local_1d8.Data = pcVar9;
  sVar10 = std::__cxx11::string::length();
  local_1d8.Length = sVar10;
  VVar4 = parseVendor(local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  this->Vendor = VVar4;
  Twine::str_abi_cxx11_(&local_228);
  local_30 = &local_208;
  local_38 = &local_228;
  pcVar9 = (char *)std::__cxx11::string::data();
  local_208.Data = pcVar9;
  sVar10 = std::__cxx11::string::length();
  local_208.Length = sVar10;
  OVar5 = parseOS(local_208);
  std::__cxx11::string::~string((string *)&local_228);
  this->OS = OVar5;
  Twine::str_abi_cxx11_(&local_258);
  local_20 = &local_238;
  local_28 = &local_258;
  pcVar9 = (char *)std::__cxx11::string::data();
  local_238.Data = pcVar9;
  sVar10 = std::__cxx11::string::length();
  local_238.Length = sVar10;
  EVar6 = parseEnvironment(local_238);
  std::__cxx11::string::~string((string *)&local_258);
  this->Environment = EVar6;
  Twine::str_abi_cxx11_(&local_288);
  local_10 = &local_268;
  local_18 = &local_288;
  pcVar9 = (char *)std::__cxx11::string::data();
  local_268.Data = pcVar9;
  sVar10 = std::__cxx11::string::length();
  local_268.Length = sVar10;
  OVar7 = parseFormat(local_268);
  std::__cxx11::string::~string((string *)&local_288);
  this->ObjectFormat = OVar7;
  if (this->ObjectFormat == UnknownObjectFormat) {
    OVar7 = getDefaultFormat(this);
    this->ObjectFormat = OVar7;
  }
  return;
}

Assistant:

Triple::Triple(const Twine &ArchStr, const Twine &VendorStr, const Twine &OSStr,
               const Twine &EnvironmentStr)
    : Data((ArchStr + Twine('-') + VendorStr + Twine('-') + OSStr + Twine('-') +
            EnvironmentStr).str()),
      Arch(parseArch(ArchStr.str())),
      SubArch(parseSubArch(ArchStr.str())),
      Vendor(parseVendor(VendorStr.str())),
      OS(parseOS(OSStr.str())),
      Environment(parseEnvironment(EnvironmentStr.str())),
      ObjectFormat(parseFormat(EnvironmentStr.str())) {
  if (ObjectFormat == Triple::UnknownObjectFormat)
    ObjectFormat = getDefaultFormat(*this);
}